

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O0

void __thiscall
QtMWidgets::DateTimePickerPrivate::fillValues(DateTimePickerPrivate *this,bool updateIndexes)

{
  qsizetype qVar1;
  reference pSVar2;
  const_reference pSVar3;
  int local_18;
  int i;
  bool updateIndexes_local;
  DateTimePickerPrivate *this_local;
  
  local_18 = 0;
  while( true ) {
    qVar1 = QList<QtMWidgets::Section>::size(&(this->super_DateTimeParser).sections);
    if (qVar1 <= local_18) break;
    pSVar2 = QList<QtMWidgets::Section>::operator[]
                       (&(this->super_DateTimeParser).sections,(long)local_18);
    Section::fillValues(pSVar2,&this->value,&this->minimum,&this->maximum,updateIndexes);
    pSVar3 = QList<QtMWidgets::Section>::at(&(this->super_DateTimeParser).sections,(long)local_18);
    if (pSVar3->currentIndex == -1) {
      pSVar2 = QList<QtMWidgets::Section>::operator[]
                         (&(this->super_DateTimeParser).sections,(long)local_18);
      pSVar2->currentIndex = 0;
    }
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void
DateTimePickerPrivate::fillValues( bool updateIndexes )
{
	for( int i = 0; i < sections.size(); ++i )
	{
		sections[ i ].fillValues( value, minimum, maximum,
			updateIndexes );

		if( sections.at( i ).currentIndex == -1 )
			sections[ i ].currentIndex = 0;
	}
}